

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O3

void __thiscall
ExchangeSectionFixups_RoundTripInternalCollection_Test::TestBody
          (ExchangeSectionFixups_RoundTripInternalCollection_Test *this)

{
  string *src;
  pointer *__ptr_1;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  internal_fixup_collection ifixups;
  internal_fixup_collection imported_ifixups;
  ostringstream os;
  string_mapping imported_names;
  undefined1 local_248 [32];
  internal local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_218;
  undefined1 local_210 [32];
  AssertHelper local_1f0;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> local_1e8;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> local_1c8;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> local_1b0;
  not_null<pstore::database_*> local_198;
  ostringstream local_190;
  parser<pstore::exchange::import_ns::callbacks> local_140;
  string_mapping local_98;
  
  local_1e8.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190.super_ostream_base._vptr_ostream_base =
       (_func_int **)((ulong)local_190.super_ostream_base._vptr_ostream_base & 0xffffffffffffff00);
  local_248[0] = '\x11';
  local_140.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>,_true,_true>
        )(__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          )0x13;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x17;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &local_1e8,(section_kind *)&local_190,local_248,(unsigned_long *)&local_140,
             (long *)&local_98);
  local_190.super_ostream_base._vptr_ostream_base =
       (_func_int **)((ulong)local_190.super_ostream_base._vptr_ostream_base & 0xffffffffffffff00);
  local_248[0] = '\x1d';
  local_140.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>,_true,_true>
        )(__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          )0x1f;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x25;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &local_1e8,(section_kind *)&local_190,local_248,(unsigned_long *)&local_140,
             (long *)&local_98);
  local_190.super_ostream_base._vptr_ostream_base =
       (_func_int **)CONCAT71(local_190.super_ostream_base._vptr_ostream_base._1_7_,0xc);
  local_248[0] = 0x29;
  local_140.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>,_true,_true>
        )(__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          )0x2b;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2f;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &local_1e8,(section_kind *)&local_190,local_248,(unsigned_long *)&local_140,
             (long *)&local_98);
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_190.super_ostream_base,0x1000);
  local_190.str_._M_dataplus._M_p = (pointer)&local_190.str_.field_2;
  local_190.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_0023b498;
  local_190.str_._M_string_length = 0;
  local_190.str_.field_2._M_local_buf[0] = '\0';
  pstore::exchange::export_ns::
  emit_array<pstore::exchange::export_ns::ostream_base,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,pstore::exchange::export_ns::emit_internal_fixups<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>)::_lambda(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::repo::internal_fixup_const&)_1_>
            (&local_190,0,
             local_1e8.
             super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98.strings_;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_98.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98.views_;
  local_98.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_98.lookup_._M_h._M_buckets = &local_98.lookup_._M_h._M_single_bucket;
  local_98.lookup_._M_h._M_bucket_count = 1;
  local_98.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98.lookup_._M_h._M_element_count = 0;
  local_98.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_98.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_98.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1c8.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.ptr_ = &(this->super_ExchangeSectionFixups).db_;
  local_98.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_98.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_98.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_98.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_198);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,pstore::repo::internal_fixup>,pstore::exchange::import_ns::string_mapping*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>,pstore::exchange::import_ns::string_mapping*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>
            ((callbacks *)local_210,local_198,&local_98,&local_1c8);
  local_248._0_8_ = local_210._0_8_;
  local_248._8_8_ = local_210._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_210._8_8_ + 8) = *(_Atomic_word *)(local_210._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_210._8_8_ + 8) = *(_Atomic_word *)(local_210._8_8_ + 8) + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            (&local_140,(callbacks *)local_248,none);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
  }
  src = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_190);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::input(&local_140,src);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(&local_140);
  local_228[0] = (internal)(local_140.error_._M_value == 0);
  local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_228[0]) {
    std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::vector
              ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                *)local_248,&local_1e8);
    std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::vector
              (&local_1b0,
               (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                *)local_248);
    if ((element_type *)local_248._0_8_ != (element_type *)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::vector
              ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                *)local_248,&local_1b0);
    std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::vector
              ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                *)local_210,
               (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                *)local_248);
    if ((element_type *)local_248._0_8_ != (element_type *)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>>
    ::operator()(local_228,local_210,
                 (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                  *)"imported_ifixups");
    if ((element_type *)local_210._0_8_ != (element_type *)0x0) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ - local_210._0_8_);
    }
    if (local_1b0.
        super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.
                      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b0.
                            super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.
                            super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_228[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_248);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_248._0_8_ + 0x10),
                 "The imported and exported ifixups should match",0x2e);
      if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_220->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_210,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x77,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_248);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )local_248._0_8_ !=
          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)local_248._0_8_ + 8))();
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_140.error_._M_cat + 0x20))
              (local_248,local_140.error_._M_cat,local_140.error_._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218._M_head_impl + 0x10),(char *)local_248._0_8_,local_248._8_8_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,local_228,(AssertionResult *)0x1d9922,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x76,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((element_type *)local_210._0_8_ != (element_type *)(local_210 + 0x10)) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    if ((element_type *)local_248._0_8_ != (element_type *)(local_248 + 0x10)) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_220,local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.string_._M_dataplus._M_p != &local_140.string_.field_2) {
    operator_delete(local_140.string_._M_dataplus._M_p,
                    local_140.string_.field_2._M_allocated_capacity + 1);
  }
  if (local_140.callbacks_.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.callbacks_.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_140.stack_.c);
  if (local_140.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_140.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  if (local_1c8.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_98);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_190);
  if (local_1e8.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F (ExchangeSectionFixups, RoundTripInternalCollection) {
    // Start with a small collection of internal fixups.
    internal_fixup_collection ifixups;
    ifixups.emplace_back (pstore::repo::section_kind::text, pstore::repo::relocation_type{17},
                          std::uint64_t{19} /*offset */, std::int64_t{23} /*addend*/);
    ifixups.emplace_back (pstore::repo::section_kind::text, pstore::repo::relocation_type{29},
                          std::uint64_t{31} /*offset */, std::int64_t{37} /*addend*/);
    ifixups.emplace_back (pstore::repo::section_kind::thread_data,
                          pstore::repo::relocation_type{41}, std::uint64_t{43} /*offset */,
                          std::int64_t{47} /*addend*/);

    // Export the internal fixup array to the 'os' string-stream.
    pstore::exchange::export_ns::ostringstream os;
    emit_internal_fixups (os, pstore::exchange::export_ns::indent{}, std::begin (ifixups),
                          std::end (ifixups));

    // Setup the parse.
    pstore::exchange::import_ns::string_mapping imported_names;
    internal_fixup_collection imported_ifixups;
    auto parser = pstore::json::make_parser (
        pstore::exchange::import_ns::callbacks::make<internal_fixup_array_root> (
            &db_, &imported_names, &imported_ifixups));

    // Import the data that we just exported.
    parser.input (os.str ());
    parser.eof ();

    // Check that we got back what we started with.
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_THAT (imported_ifixups, testing::ContainerEq (ifixups))
        << "The imported and exported ifixups should match";
}